

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mfdcr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i64 pTVar1;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    pTVar1 = tcg_const_i64_ppc64(tcg_ctx,(ulong)(ctx->opcode >> 6 & 0x3e0 |
                                                ctx->opcode >> 0x10 & 0x1f));
    local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_load_dcr_ppc64,
                        (TCGTemp *)
                        ((long)&tcg_ctx->pool_cur +
                        *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8))),2,&local_28)
    ;
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_mfdcr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv dcrn;

    CHK_SV;
    dcrn = tcg_const_tl(tcg_ctx, SPR(ctx->opcode));
    gen_helper_load_dcr(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, dcrn);
    tcg_temp_free(tcg_ctx, dcrn);
}